

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O0

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  aiNode *paVar1;
  undefined1 auVar2 [16];
  _List_base<aiNode_*,_std::allocator<aiNode_*>_> *p_Var3;
  list<aiNode_*,_std::allocator<aiNode_*>_> *plVar4;
  aiString *paVar5;
  size_t this_00;
  bool bVar6;
  ai_uint32 aVar7;
  reference pvVar8;
  reference ppaVar9;
  uint *puVar10;
  aiMatrix3x3t<float> *paVar11;
  size_type sVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  reference ppaVar15;
  float fVar16;
  bool local_379;
  aiNode *node;
  _Self local_2f0;
  iterator it_3;
  aiNode **tmp_1;
  uint a;
  undefined1 local_2b4 [8];
  aiMatrix3x3 IT;
  aiMesh *mesh;
  uint n_2;
  aiNode *join_node;
  iterator __end4;
  iterator __begin4;
  list<aiNode_*,_std::allocator<aiNode_*>_> *__range4;
  uint *puStack_258;
  uint n_1;
  uint *tmp;
  uint *meshes;
  _Self local_240;
  const_iterator it_2;
  _List_const_iterator<aiNode_*> _Stack_230;
  uint out_meshes;
  _List_node_base *local_228;
  aiMatrix4x4t<float> local_220;
  uint local_1e0;
  byte local_1db;
  byte local_1da;
  allocator<char> local_1d9;
  uint n;
  _Self local_1b8;
  aiNode *local_1b0;
  aiNode *child;
  _Self local_1a0;
  iterator it_1;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  const_iterator end;
  aiMatrix4x4 inv;
  aiNode *local_130;
  aiNode *join_master;
  const_iterator local_120;
  _List_node_base *local_118;
  aiMatrix4x4t<float> local_110;
  _Self local_d0;
  allocator<char> local_c1;
  key_type local_c0;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  iterator it;
  allocator<char> local_79;
  key_type local_78;
  _Self local_58 [3];
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  list<aiNode_*,_std::allocator<aiNode_*>_> *nodes_local;
  aiNode *nd_local;
  OptimizeGraphProcess *this_local;
  
  this->nodes_in = nd->mNumChildren + this->nodes_in;
  child_nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
       (size_t)nodes;
  nodes_local = (list<aiNode_*,_std::allocator<aiNode_*>_> *)nd;
  nd_local = (aiNode *)this;
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
  for (local_3c = 0;
      local_3c <
      *(uint *)&nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; local_3c = local_3c + 1) {
    CollectNewChildren(this,(aiNode *)
                            (&(nodes_local[0x2e].
                               super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node
                               .super__List_node_base._M_prev)->_M_next)[local_3c],
                       (list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
    (&(nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_prev)->_M_next)[local_3c] = (_List_node_base *)0x0;
  }
  p_Var3 = &nodes_local->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             (char *)((long)&(p_Var3->_M_impl)._M_node.super__List_node_base._M_next + 4),&local_79)
  ;
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->locked,&local_78);
  it._M_node = (_List_node_base *)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->locked);
  bVar6 = std::operator==(local_58,(_Self *)&it);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar6) {
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                   ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
    while( true ) {
      local_98._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                     ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
      bVar6 = std::operator!=(&local_90,&local_98);
      if (!bVar6) break;
      ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_90);
      paVar1 = *ppaVar15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,(paVar1->mName).data,&local_c1);
      local_a0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->locked,&local_c0);
      local_d0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->locked);
      bVar6 = std::operator==(&local_a0,&local_d0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      if (bVar6) {
        plVar4 = nodes_local + 0x2a;
        ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_90);
        aiMatrix4x4t<float>::operator*
                  (&local_110,
                   (aiMatrix4x4t<float> *)
                   ((long)&(plVar4->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                           _M_node._M_size + 4),&(*ppaVar15)->mTransformation);
        ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_90);
        this_00 = child_nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                  _M_size;
        paVar1 = *ppaVar15;
        (paVar1->mTransformation).d1 = local_110.d1;
        (paVar1->mTransformation).d2 = local_110.d2;
        (paVar1->mTransformation).d3 = local_110.d3;
        (paVar1->mTransformation).d4 = local_110.d4;
        (paVar1->mTransformation).c1 = local_110.c1;
        (paVar1->mTransformation).c2 = local_110.c2;
        (paVar1->mTransformation).c3 = local_110.c3;
        (paVar1->mTransformation).c4 = local_110.c4;
        (paVar1->mTransformation).b1 = local_110.b1;
        (paVar1->mTransformation).b2 = local_110.b2;
        (paVar1->mTransformation).b3 = local_110.b3;
        (paVar1->mTransformation).b4 = local_110.b4;
        (paVar1->mTransformation).a1 = local_110.a1;
        (paVar1->mTransformation).a2 = local_110.a2;
        (paVar1->mTransformation).a3 = local_110.a3;
        (paVar1->mTransformation).a4 = local_110.a4;
        ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_90);
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((list<aiNode_*,_std::allocator<aiNode_*>_> *)this_00,ppaVar15);
        std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_120,&local_90);
        local_118 = (_List_node_base *)
                    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38,local_120);
        local_90._M_node = local_118;
      }
      else {
        std::_List_iterator<aiNode_*>::operator++(&local_90);
      }
    }
    if (((int)nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              _M_node._M_size == 0) &&
       (bVar6 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                          ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38),
       plVar4 = nodes_local, bVar6)) {
      if (nodes_local != (list<aiNode_*,_std::allocator<aiNode_*>_> *)0x0) {
        aiNode::~aiNode((aiNode *)nodes_local);
        operator_delete(plVar4,0x478);
      }
      goto LAB_005ce98b;
    }
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
               child_nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size,(value_type *)&nodes_local);
  }
  else {
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
               child_nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size,(value_type *)&nodes_local);
    local_130 = (aiNode *)0x0;
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&end);
    join.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
         (size_t)std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->locked);
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
    local_1a0._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                   ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
    while( true ) {
      child = (aiNode *)
              std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                        ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
      bVar6 = std::operator!=(&local_1a0,(_Self *)&child);
      if (!bVar6) break;
      ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_1a0);
      local_1b0 = *ppaVar15;
      local_1da = 0;
      local_1db = 0;
      local_379 = false;
      if (local_1b0->mNumChildren == 0) {
        paVar5 = &local_1b0->mName;
        std::allocator<char>::allocator();
        local_1da = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&n,paVar5->data,&local_1d9);
        local_1db = 1;
        local_1b8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->locked,(key_type *)&n);
        local_379 = std::operator==(&local_1b8,
                                    (_Self *)&join.
                                              super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                              _M_impl._M_node._M_size);
      }
      if ((local_1db & 1) != 0) {
        std::__cxx11::string::~string((string *)&n);
      }
      if ((local_1da & 1) != 0) {
        std::allocator<char>::~allocator(&local_1d9);
      }
      if (local_379 == false) {
LAB_005ce302:
        std::_List_iterator<aiNode_*>::operator++(&local_1a0);
      }
      else {
        local_1e0 = 0;
        while ((local_1e0 < local_1b0->mNumMeshes &&
               (pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   (&this->meshes,(ulong)local_1b0->mMeshes[local_1e0]), *pvVar8 < 2
               ))) {
          local_1e0 = local_1e0 + 1;
        }
        if (local_1e0 != local_1b0->mNumMeshes) goto LAB_005ce302;
        if (local_130 == (aiNode *)0x0) {
          local_130 = local_1b0;
          end._M_node = *(_Base_ptr *)&local_1b0->mTransformation;
          aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&end);
          goto LAB_005ce302;
        }
        aiMatrix4x4t<float>::operator*
                  (&local_220,(aiMatrix4x4t<float> *)&end,&local_1b0->mTransformation);
        (local_1b0->mTransformation).d1 = local_220.d1;
        (local_1b0->mTransformation).d2 = local_220.d2;
        (local_1b0->mTransformation).d3 = local_220.d3;
        (local_1b0->mTransformation).d4 = local_220.d4;
        (local_1b0->mTransformation).c1 = local_220.c1;
        (local_1b0->mTransformation).c2 = local_220.c2;
        (local_1b0->mTransformation).c3 = local_220.c3;
        (local_1b0->mTransformation).c4 = local_220.c4;
        (local_1b0->mTransformation).b1 = local_220.b1;
        (local_1b0->mTransformation).b2 = local_220.b2;
        (local_1b0->mTransformation).b3 = local_220.b3;
        (local_1b0->mTransformation).b4 = local_220.b4;
        (local_1b0->mTransformation).a1 = local_220.a1;
        (local_1b0->mTransformation).a2 = local_220.a2;
        (local_1b0->mTransformation).a3 = local_220.a3;
        (local_1b0->mTransformation).a4 = local_220.a4;
        std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1,&local_1b0);
        std::_List_const_iterator<aiNode_*>::_List_const_iterator
                  (&stack0xfffffffffffffdd0,&local_1a0);
        local_228 = (_List_node_base *)
                    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38,
                               _Stack_230._M_node);
        local_1a0._M_node = local_228;
      }
    }
    if ((local_130 != (aiNode *)0x0) &&
       (bVar6 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                          ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1), !bVar6)) {
      this->count_merged = this->count_merged + 1;
      aVar7 = snprintf((local_130->mName).data,0x400,"$MergedNode_%i");
      (local_130->mName).length = aVar7;
      it_2._M_node._4_4_ = 0;
      local_240._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::cbegin
                     ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
      while( true ) {
        meshes = (uint *)std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::cend
                                   ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
        bVar6 = std::operator!=(&local_240,(_Self *)&meshes);
        if (!bVar6) break;
        ppaVar9 = std::_List_const_iterator<aiNode_*>::operator*(&local_240);
        it_2._M_node._4_4_ = (*ppaVar9)->mNumMeshes + it_2._M_node._4_4_;
        std::_List_const_iterator<aiNode_*>::operator++(&local_240);
      }
      if (it_2._M_node._4_4_ != 0) {
        puVar10 = (uint *)operator_new__((ulong)(it_2._M_node._4_4_ + local_130->mNumMeshes) << 2);
        puStack_258 = puVar10;
        for (__range4._4_4_ = 0; __range4._4_4_ < local_130->mNumMeshes;
            __range4._4_4_ = __range4._4_4_ + 1) {
          *puStack_258 = local_130->mMeshes[__range4._4_4_];
          puStack_258 = puStack_258 + 1;
        }
        __end4 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                           ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
        join_node = (aiNode *)
                    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
        while (bVar6 = std::operator!=(&__end4,(_Self *)&join_node), bVar6) {
          ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&__end4);
          paVar1 = *ppaVar15;
          for (mesh._4_4_ = 0; mesh._4_4_ < paVar1->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
            *puStack_258 = paVar1->mMeshes[mesh._4_4_];
            IT._28_8_ = this->mScene->mMeshes[*puStack_258];
            fVar16 = aiMatrix4x4t<float>::Determinant(&paVar1->mTransformation);
            if (fVar16 < 0.0) {
              FlipWindingOrderProcess::ProcessMesh((aiMesh *)IT._28_8_);
            }
            aiMatrix3x3t<float>::aiMatrix3x3t
                      ((aiMatrix3x3t<float> *)&stack0xfffffffffffffd28,&paVar1->mTransformation);
            paVar11 = aiMatrix3x3t<float>::Inverse((aiMatrix3x3t<float> *)&stack0xfffffffffffffd28);
            paVar11 = aiMatrix3x3t<float>::Transpose(paVar11);
            memcpy(local_2b4,paVar11,0x24);
            for (tmp_1._4_4_ = 0; tmp_1._4_4_ < *(uint *)(IT._28_8_ + 4);
                tmp_1._4_4_ = tmp_1._4_4_ + 1) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)
                         (*(long *)(IT._28_8_ + 0x10) + (ulong)tmp_1._4_4_ * 0xc),
                         &paVar1->mTransformation);
              bVar6 = aiMesh::HasNormals((aiMesh *)IT._28_8_);
              if (bVar6) {
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)
                           (*(long *)(IT._28_8_ + 0x18) + (ulong)tmp_1._4_4_ * 0xc),
                           (aiMatrix3x3t<float> *)local_2b4);
              }
              bVar6 = aiMesh::HasTangentsAndBitangents((aiMesh *)IT._28_8_);
              if (bVar6) {
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)
                           (*(long *)(IT._28_8_ + 0x20) + (ulong)tmp_1._4_4_ * 0xc),
                           (aiMatrix3x3t<float> *)local_2b4);
                aiVector3t<float>::operator*=
                          ((aiVector3t<float> *)
                           (*(long *)(IT._28_8_ + 0x28) + (ulong)tmp_1._4_4_ * 0xc),
                           (aiMatrix3x3t<float> *)local_2b4);
              }
            }
            puStack_258 = puStack_258 + 1;
          }
          if (paVar1 != (aiNode *)0x0) {
            aiNode::~aiNode(paVar1);
            operator_delete(paVar1,0x478);
          }
          std::_List_iterator<aiNode_*>::operator++(&__end4);
        }
        if (local_130->mMeshes != (uint *)0x0) {
          operator_delete__(local_130->mMeshes);
        }
        local_130->mMeshes = puVar10;
        local_130->mNumMeshes = it_2._M_node._4_4_ + local_130->mNumMeshes;
      }
    }
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&it_1);
  }
  bVar6 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                    ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
  if ((bVar6) ||
     (sVar12 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                         ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38),
     *(uint *)&nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               _M_node.super__List_node_base._M_next < sVar12)) {
    p_Var14 = nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              _M_node.super__List_node_base._M_prev;
    if (p_Var14 != (_List_node_base *)0x0) {
      operator_delete__(p_Var14);
    }
    bVar6 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                      ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
    if (bVar6) {
      nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)0x0;
    }
    else {
      sVar12 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                         ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sVar12;
      uVar13 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      p_Var14 = (_List_node_base *)operator_new__(uVar13);
      nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_prev = p_Var14;
    }
  }
  sVar12 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                     ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
  *(int *)&nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
           super__List_node_base._M_next = (int)sVar12;
  if (nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_prev != (_List_node_base *)0x0) {
    it_3._M_node = nodes_local[0x2e].super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   _M_node.super__List_node_base._M_prev;
    local_2f0._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                   ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
    while( true ) {
      node = (aiNode *)
             std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::end
                       ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
      bVar6 = std::operator!=(&local_2f0,(_Self *)&node);
      if (!bVar6) break;
      ppaVar15 = std::_List_iterator<aiNode_*>::operator*(&local_2f0);
      paVar1 = *ppaVar15;
      (it_3._M_node)->_M_next = (_List_node_base *)paVar1;
      paVar1->mParent = (aiNode *)nodes_local;
      it_3._M_node = (_List_node_base *)&(it_3._M_node)->_M_prev;
      std::_List_iterator<aiNode_*>::operator++(&local_2f0);
    }
  }
  sVar12 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                     ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
  this->nodes_out = (int)sVar12 + this->nodes_out;
LAB_005ce98b:
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_38);
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode *nd, std::list<aiNode *> &nodes) {
	nodes_in += nd->mNumChildren;

	// Process children
	std::list<aiNode *> child_nodes;
	for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
		CollectNewChildren(nd->mChildren[i], child_nodes);
		nd->mChildren[i] = nullptr;
	}

	// Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
	if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end()) {
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

			if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
				(*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
				nodes.push_back(*it);

				it = child_nodes.erase(it);
				continue;
			}
			++it;
		}

		if (nd->mNumMeshes || !child_nodes.empty()) {
			nodes.push_back(nd);
		} else {
			delete nd; /* bye, node */
			return;
		}
	} else {

		// Retain our current position in the hierarchy
		nodes.push_back(nd);

		// Now check for possible optimizations in our list of child nodes. join as many as possible
		aiNode *join_master = nullptr;
		aiMatrix4x4 inv;

		const LockedSetType::const_iterator end = locked.end();

		std::list<aiNode *> join;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {
			aiNode *child = *it;
			if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

				// There may be no instanced meshes
				unsigned int n = 0;
				for (; n < child->mNumMeshes; ++n) {
					if (meshes[child->mMeshes[n]] > 1) {
						break;
					}
				}
				if (n == child->mNumMeshes) {
					if (!join_master) {
						join_master = child;
						inv = join_master->mTransformation;
						inv.Inverse();
					} else {
						child->mTransformation = inv * child->mTransformation;

						join.push_back(child);
						it = child_nodes.erase(it);
						continue;
					}
				}
			}
			++it;
		}
		if (join_master && !join.empty()) {
			join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i", count_merged++);

			unsigned int out_meshes = 0;
			for (std::list<aiNode *>::const_iterator it = join.cbegin(); it != join.cend(); ++it) {
				out_meshes += (*it)->mNumMeshes;
			}

			// copy all mesh references in one array
			if (out_meshes) {
				unsigned int *meshes = new unsigned int[out_meshes + join_master->mNumMeshes], *tmp = meshes;
				for (unsigned int n = 0; n < join_master->mNumMeshes; ++n) {
					*tmp++ = join_master->mMeshes[n];
				}

				for (const aiNode *join_node : join) {
					for (unsigned int n = 0; n < join_node->mNumMeshes; ++n) {

						*tmp = join_node->mMeshes[n];
						aiMesh *mesh = mScene->mMeshes[*tmp++];

						// Assume the transformation is affine
						// manually move the mesh into the right coordinate system

						// Check for odd negative scale (mirror)
						if (join_node->mTransformation.Determinant() < 0) {
							// Reverse the mesh face winding order
                            FlipWindingOrderProcess::ProcessMesh(mesh);
						}

                        // Update positions, normals and tangents
						const aiMatrix3x3 IT = aiMatrix3x3(join_node->mTransformation).Inverse().Transpose();
						for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

							mesh->mVertices[a] *= join_node->mTransformation;

							if (mesh->HasNormals())
								mesh->mNormals[a] *= IT;

							if (mesh->HasTangentsAndBitangents()) {
								mesh->mTangents[a] *= IT;
								mesh->mBitangents[a] *= IT;
							}
						}
					}
					delete join_node; // bye, node
				}
				delete[] join_master->mMeshes;
				join_master->mMeshes = meshes;
				join_master->mNumMeshes += out_meshes;
			}
		}
	}
	// reassign children if something changed
	if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

		delete[] nd->mChildren;

		if (!child_nodes.empty()) {
			nd->mChildren = new aiNode *[child_nodes.size()];
		} else
			nd->mChildren = nullptr;
	}

	nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

	if (nd->mChildren) {
		aiNode **tmp = nd->mChildren;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
			aiNode *node = *tmp++ = *it;
			node->mParent = nd;
		}
	}

	nodes_out += static_cast<unsigned int>(child_nodes.size());
}